

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qintc.cc
# Opt level: O0

void try_convert_real<char,char>(char *description,bool exp_pass,_func_char_char_ptr *fn,char *i)

{
  char cVar1;
  ostream *poVar2;
  char *local_88;
  range_error *e;
  char result;
  bool passed;
  char *i_local;
  _func_char_char_ptr *fn_local;
  bool exp_pass_local;
  char *description_local;
  
  cVar1 = (*fn)(i);
  poVar2 = std::operator<<((ostream *)&std::cout,description);
  poVar2 = std::operator<<(poVar2,": ");
  poVar2 = std::operator<<(poVar2,*i);
  poVar2 = std::operator<<(poVar2," ");
  std::operator<<(poVar2,cVar1);
  if (exp_pass) {
    local_88 = " PASSED";
  }
  else {
    local_88 = " FAILED";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,local_88);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void
try_convert_real(char const* description, bool exp_pass, To (*fn)(From const&), From const& i)
{
    bool passed = false;
    try {
        To result = fn(i);
        passed = true;
        std::cout << description << ": " << i << " " << result;
    } catch (std::range_error& e) {
        std::cout << description << ": " << e.what();
        passed = false;
    }
    std::cout << ((passed == exp_pass) ? " PASSED" : " FAILED") << std::endl;
}